

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_wildcard
          (Compiler *this,Ptr *node,uint16_t write_index,uint16_t *extent_index,bool write)

{
  bool bVar1;
  Atom *this_00;
  allocator local_51;
  string local_50;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  bVar1 = std::operator==(&((node->
                            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->cmd,":");
  if (bVar1) {
    if ((this->state).pattern_lvl != 0) {
      if (!write) {
        return true;
      }
      r_code::Atom::Wildcard((ushort)&local_50);
      this_00 = r_code::vector<r_code::Atom>::operator[]
                          ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
      r_code::Atom::operator=(this_00,(Atom *)&local_50);
      r_code::Atom::~Atom((Atom *)&local_50);
      return true;
    }
    std::__cxx11::string::string
              ((string *)&local_50," error: no wildcards allowed outside a pattern skeleton",
               &local_51);
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
    ;
    set_error(this,&local_50,(Ptr *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return false;
}

Assistant:

bool Compiler::read_wildcard(RepliStruct::Ptr node, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (node->cmd == ":") {
        if (state.pattern_lvl) {
            if (write) {
                current_object->code[write_index] = Atom::Wildcard();
            }

            return true;
        } else {
            set_error(" error: no wildcards allowed outside a pattern skeleton", node);
            return false;
        }
    }

    return false;
}